

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# case_simplification.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::CaseSimplificationRule::Apply
          (CaseSimplificationRule *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  vector<duckdb::BoundCaseCheck,_true> *this_00;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  pointer pBVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  BoundCaseExpression *pBVar6;
  reference this_01;
  pointer pEVar7;
  ClientContext *context;
  type expr;
  long lVar8;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar9;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var10;
  unsigned_long __n;
  Value condition;
  Value constant_value;
  LogicalType local_c8;
  Value local_b0;
  Value local_70;
  
  pvVar5 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  pBVar6 = BaseExpression::Cast<duckdb::BoundCaseExpression>(&pvVar5->_M_data->super_BaseExpression)
  ;
  if ((pBVar6->case_checks).
      super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
      super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pBVar6->case_checks).
      super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
      super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = &pBVar6->case_checks;
    __n = 0;
    do {
      this_01 = vector<duckdb::BoundCaseCheck,_true>::operator[](this_00,__n);
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(&this_01->when_expr);
      iVar4 = (*(pEVar7->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar7);
      bVar3 = true;
      if ((char)iVar4 != '\0') {
        context = Rule::GetContext((Rule *)op);
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&this_01->when_expr);
        ExpressionExecutor::EvaluateScalar(&local_70,context,expr,false);
        LogicalType::LogicalType(&local_c8,BOOLEAN);
        Value::DefaultCastAs(&local_b0,&local_70,&local_c8,false);
        LogicalType::~LogicalType(&local_c8);
        if (local_b0.is_null == false) {
          bVar3 = BooleanValue::Get(&local_b0);
          if (!bVar3) goto LAB_0116d51a;
          _Var10._M_head_impl =
               (this_01->then_expr).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (this_01->then_expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          _Var1._M_head_impl =
               (pBVar6->else_expr).
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pBVar6->else_expr).
          super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var10._M_head_impl;
          if (_Var1._M_head_impl != (Expression *)0x0) {
            (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
          }
          pBVar2 = (this_00->
                   super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>).
                   super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar8 = NumericCastImpl<long,_unsigned_long,_false>::Convert(__n);
          ::std::vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>::_M_erase
                    (&this_00->
                      super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>,
                     pBVar2 + lVar8,
                     (pBVar6->case_checks).
                     super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
                     super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          bVar3 = false;
        }
        else {
LAB_0116d51a:
          vector<duckdb::BoundCaseCheck,_true>::erase_at(this_00,__n);
          __n = __n - 1;
          bVar3 = true;
        }
        Value::~Value(&local_b0);
        Value::~Value(&local_70);
      }
    } while ((bVar3) &&
            (__n = __n + 1,
            __n < (ulong)((long)(pBVar6->case_checks).
                                super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                .
                                super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pBVar6->case_checks).
                                super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                .
                                super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4)));
  }
  if ((pBVar6->case_checks).
      super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
      super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pBVar6->case_checks).
      super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>.
      super__Vector_base<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    _Var10._M_head_impl =
         (pBVar6->else_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    puVar9 = &pBVar6->else_expr;
  }
  else {
    _Var10._M_head_impl = (Expression *)0x0;
    puVar9 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)this;
  }
  (this->super_Rule)._vptr_Rule = (_func_int **)_Var10._M_head_impl;
  (puVar9->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> CaseSimplificationRule::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                     bool &changes_made, bool is_root) {
	auto &root = bindings[0].get().Cast<BoundCaseExpression>();
	for (idx_t i = 0; i < root.case_checks.size(); i++) {
		auto &case_check = root.case_checks[i];
		if (case_check.when_expr->IsFoldable()) {
			// the WHEN check is a foldable expression
			// use an ExpressionExecutor to execute the expression
			auto constant_value = ExpressionExecutor::EvaluateScalar(GetContext(), *case_check.when_expr);

			// fold based on the constant condition
			auto condition = constant_value.DefaultCastAs(LogicalType::BOOLEAN);
			if (condition.IsNull() || !BooleanValue::Get(condition)) {
				// the condition is always false: remove this case check
				root.case_checks.erase_at(i);
				i--;
			} else {
				// the condition is always true
				// move the THEN clause to the ELSE of the case
				root.else_expr = std::move(case_check.then_expr);
				// remove this case check and any case checks after this one
				root.case_checks.erase(root.case_checks.begin() + NumericCast<int64_t>(i), root.case_checks.end());
				break;
			}
		}
	}
	if (root.case_checks.empty()) {
		// no case checks left: return the ELSE expression
		return std::move(root.else_expr);
	}
	return nullptr;
}